

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

bool __thiscall S2Cap::Decode(S2Cap *this,Decoder *decoder)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  double length2;
  S2LogMessage local_70;
  S2LogMessageVoidify local_59;
  double local_58;
  Vector3<double> local_50;
  double local_38;
  double z;
  double y;
  double x;
  Decoder *decoder_local;
  S2Cap *this_local;
  
  x = (double)decoder;
  decoder_local = (Decoder *)this;
  sVar2 = Decoder::avail(decoder);
  if (sVar2 < 0x20) {
    this_local._7_1_ = false;
  }
  else {
    y = Decoder::getdouble((Decoder *)x);
    z = Decoder::getdouble((Decoder *)x);
    local_38 = Decoder::getdouble((Decoder *)x);
    Vector3<double>::Vector3(&local_50,y,z,local_38);
    (this->center_).c_[0] = local_50.c_[0];
    (this->center_).c_[1] = local_50.c_[1];
    (this->center_).c_[2] = local_50.c_[2];
    length2 = Decoder::getdouble((Decoder *)x);
    local_58 = (double)S1ChordAngle::FromLength2(length2);
    (this->radius_).length2_ = local_58;
    if (((FLAGS_s2debug & 1U) != 0) && (bVar1 = is_valid(this), ((bVar1 ^ 0xffU) & 1) != 0)) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
                 ,0x158,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_70);
      poVar3 = std::operator<<(poVar3,"Check failed: is_valid() ");
      poVar3 = std::operator<<(poVar3,"Invalid S2Cap: ");
      poVar3 = ::operator<<(poVar3,this);
      S2LogMessageVoidify::operator&(&local_59,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_70);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool S2Cap::Decode(Decoder* decoder) {
  if (decoder->avail() < 4 * sizeof(double)) return false;

  double x = decoder->getdouble();
  double y = decoder->getdouble();
  double z = decoder->getdouble();
  center_ = S2Point(x, y, z);
  radius_ = S1ChordAngle::FromLength2(decoder->getdouble());

  if (FLAGS_s2debug) {
     S2_CHECK(is_valid()) << "Invalid S2Cap: " << *this;
  }
  return true;
}